

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

void __thiscall Clasp::ClaspStatistics::Impl::visit(Impl *this,StatisticObject *obj,KeySet *visited)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  E EVar3;
  uint32 uVar4;
  reference ppIVar5;
  char *k;
  __hash_code __code;
  ulong uVar6;
  __hashtable *__h;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  uint32 uVar10;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar11;
  __node_gen_type __node_gen;
  StatisticObject local_38;
  
  p_Var7 = (_Hash_node_base *)obj->handle_;
  uVar1 = (this->objects_)._M_h._M_bucket_count;
  uVar6 = (ulong)p_Var7 % uVar1;
  p_Var8 = (this->objects_)._M_h._M_buckets[uVar6];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, p_Var7 != p_Var8->_M_nxt[1]._M_nxt)) {
    while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var9 = p_Var8, p_Var7 == p_Var2[1]._M_nxt)) goto LAB_001764ae;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_001764ae:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var9->_M_nxt;
  }
  if ((p_Var7 != (_Hash_node_base *)0x0) &&
     (local_38.handle_ = (uint64)visited,
     pVar11 = std::
              _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                        ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)visited,p_Var7 + 1),
     ((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    if (obj->handle_ == 0) {
      EVar3 = Empty;
    }
    else {
      ppIVar5 = bk_lib::
                pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                      *)StatisticObject::types_s,(uint)(ushort)(obj->handle_ >> 0x30));
      EVar3 = ((*ppIVar5)->type).val_;
    }
    if (EVar3 == Array) {
      uVar4 = StatisticObject::size(obj);
      if (uVar4 != 0) {
        uVar10 = 0;
        do {
          local_38 = StatisticObject::operator[](obj,uVar10);
          visit(this,&local_38,visited);
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
    }
    else if ((EVar3 == Map) && (uVar4 = StatisticObject::size(obj), uVar4 != 0)) {
      uVar10 = 0;
      do {
        k = StatisticObject::key(obj,uVar10);
        local_38 = StatisticObject::at(obj,k);
        visit(this,&local_38,visited);
        uVar10 = uVar10 + 1;
      } while (uVar4 != uVar10);
    }
  }
  return;
}

Assistant:

void visit(const StatisticObject& obj, KeySet& visited) {
		KeySet::iterator it = objects_.find(obj.toRep());
		if (it == objects_.end() || !visited.insert(*it).second) { return; }
		switch (obj.type()) {
			case Potassco::Statistics_t::Map:
				for (uint32 i = 0, end = obj.size(); i != end; ++i) { visit(obj.at(obj.key(i)), visited); }
				break;
			case Potassco::Statistics_t::Array:
				for (uint32 i = 0, end = obj.size(); i != end; ++i) { visit(obj[i], visited); }
				break;
			default: break;
		}
	}